

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

void lws_context_deprecate(lws_context *cx,lws_reload_func cb)

{
  lws_dll2 *plVar1;
  lws *wsi;
  lws_dll2 *d1;
  lws_dll2 *d;
  lws_vhost *vh;
  lws_reload_func cb_local;
  lws_context *cx_local;
  
  for (d = (lws_dll2 *)cx->vhost_list; d != (lws_dll2 *)0x0; d = d[0x14].next) {
    d1 = lws_dll2_get_head((lws_dll2_owner *)(d + 0x15));
    while (d1 != (lws_dll2 *)0x0) {
      plVar1 = d1->next;
      *(ulong *)((long)&d1[0x14].next + 6) =
           *(ulong *)((long)&d1[0x14].next + 6) & 0xffffffffffffefff | 0x1000;
      lws_close_free_wsi((lws *)&d1[-0x1b].next,LWS_CLOSE_STATUS_NOSTATUS,"lws_context_deprecate");
      cx->deprecation_pending_listen_close_count = cx->deprecation_pending_listen_close_count + 1;
      d1 = plVar1;
    }
  }
  *(ushort *)&cx->field_0x7b7 = *(ushort *)&cx->field_0x7b7 & 0xfffe | 1;
  cx->deprecation_cb = cb;
  return;
}

Assistant:

void
lws_context_deprecate(struct lws_context *cx, lws_reload_func cb)
{
	struct lws_vhost *vh = cx->vhost_list;

	/*
	 * "deprecation" means disable the cx from accepting any new
	 * connections and free up listen sockets to be used by a replacement
	 * cx.
	 *
	 * Otherwise the deprecated cx remains operational, until its
	 * number of connected sockets falls to zero, when it is deleted.
	 *
	 * So, for each vhost, close his listen sockets
	 */

	while (vh) {

		lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
					   lws_dll2_get_head(&vh->listen_wsi)) {
			struct lws *wsi = lws_container_of(d, struct lws,
							   listen_list);

			wsi->socket_is_permanently_unusable = 1;
			lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
					   __func__);
			cx->deprecation_pending_listen_close_count++;

		} lws_end_foreach_dll_safe(d, d1);

		vh = vh->vhost_next;
	}

	cx->deprecated = 1;
	cx->deprecation_cb = cb;
}